

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall Tokenizer::nextPos(Tokenizer *this)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_type sVar3;
  Error *this_00;
  long lVar4;
  pair<unsigned_long,_int> pVar5;
  unsigned_long local_90;
  unsigned_long local_88;
  int local_80;
  int local_74;
  unsigned_long local_70;
  pair<unsigned_long,_int> local_68;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  Tokenizer *local_20;
  Tokenizer *this_local;
  
  uVar1 = (this->_ptr).first;
  local_20 = this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->_lines_buffer);
  if (sVar3 <= uVar1) {
    local_55 = 1;
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"advance after EOF",&local_41);
    Error::Error(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  uVar2 = (this->_ptr).second;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&this->_lines_buffer,(this->_ptr).first);
  lVar4 = std::__cxx11::string::size();
  if (uVar2 == lVar4 - 1U) {
    local_70 = (this->_ptr).first + 1;
    local_74 = 0;
    pVar5 = std::make_pair<unsigned_long,int>(&local_70,&local_74);
    local_88 = pVar5.first;
    local_80 = pVar5.second;
    local_68.first = local_88;
    local_68.second = local_80;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
              ((pair<unsigned_long,_unsigned_long> *)&this_local,&local_68);
  }
  else {
    local_90 = (this->_ptr).second + 1;
    _this_local = std::make_pair<unsigned_long&,unsigned_long>(&(this->_ptr).first,&local_90);
  }
  return _this_local;
}

Assistant:

std::pair<uint64_t, uint64_t> Tokenizer::nextPos() {
	if (_ptr.first >= _lines_buffer.size())
		throw Error("advance after EOF");
	if (_ptr.second == _lines_buffer[_ptr.first].size() - 1)
		return std::make_pair(_ptr.first + 1, 0);
	else
		return std::make_pair(_ptr.first, _ptr.second + 1);
}